

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::MatchExpr<FlatMap<Point,_double,_PointCmp>,_EqualsRange<FlatMap<Point,_double,_PointCmp>_>_>
::MatchExpr(MatchExpr<FlatMap<Point,_double,_PointCmp>,_EqualsRange<FlatMap<Point,_double,_PointCmp>_>_>
            *this,FlatMap<Point,_double,_PointCmp> *arg,
           EqualsRange<FlatMap<Point,_double,_PointCmp>_> *matcher,StringRef *matcherString)

{
  bool result;
  EqualsRange<FlatMap<Point,_double,_PointCmp>_> *in_RCX;
  long *in_RDX;
  _func_int **in_RSI;
  ITransientExpression *in_RDI;
  EqualsRange<FlatMap<Point,_double,_PointCmp>_> *in_stack_ffffffffffffffd8;
  
  result = (bool)(**(code **)(*in_RDX + 0x18))(in_RDX,in_RSI);
  ITransientExpression::ITransientExpression(in_RDI,true,result);
  in_RDI->_vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_00492110;
  in_RDI[1]._vptr_ITransientExpression = in_RSI;
  EqualsRange<FlatMap<Point,_double,_PointCmp>_>::EqualsRange(in_RCX,in_stack_ffffffffffffffd8);
  *(_func_int ***)&in_RDI[6].m_isBinaryExpression =
       (in_RCX->super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>).super_MatcherUntypedBase.
       _vptr_MatcherUntypedBase;
  in_RDI[7]._vptr_ITransientExpression =
       *(_func_int ***)
        &(in_RCX->super_MatcherBase<FlatMap<Point,_double,_PointCmp>_>).super_MatcherUntypedBase.
         m_cachedToString;
  return;
}

Assistant:

MatchExpr( ArgT const& arg, MatcherT const& matcher, StringRef const& matcherString )
        :   ITransientExpression{ true, matcher.match( arg ) },
            m_arg( arg ),
            m_matcher( matcher ),
            m_matcherString( matcherString )
        {}